

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O3

__pid_t __thiscall embree::BarrierSys::wait(BarrierSys *this,void *__stat_loc)

{
  MutexSys *this_00;
  __pid_t extraout_EAX;
  
  this_00 = (MutexSys *)this->opaque;
  MutexSys::lock(this_00);
  this_00[2].mutex = (void *)((long)this_00[2].mutex + 1);
  if (this_00[2].mutex == this_00[3].mutex) {
    this_00[2].mutex = (void *)0x0;
    ConditionSys::notify_all((ConditionSys *)(this_00 + 1));
  }
  else {
    ConditionSys::wait((ConditionSys *)(this_00 + 1),this_00);
  }
  MutexSys::unlock(this_00);
  return extraout_EAX;
}

Assistant:

void BarrierSys::wait() {
    ((BarrierSysImplementation*) opaque)->wait();
  }